

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::reduce_21(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar2;
  undefined1 local_dc [44];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  shared_ptr<LNode> expr0;
  shared_ptr<LNode> op;
  shared_ptr<LNode> atom;
  shared_ptr<LNodeData<LNodeExpr>_> r;
  LNodeExpr local_60;
  
  get_node((LParser *)&atom,in_ESI);
  get_node((LParser *)&op,in_ESI);
  get_node((LParser *)&expr0,in_ESI);
  local_dc._0_4_ = 0x28;
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_dc + 0x24),
             (__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)&op);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_dc + 0x14),
             (__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)&atom);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_dc + 4),
             (__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)&expr0);
  LNodeExpr::LNodeExpr
            (&local_60,(shared_ptr<LNode> *)(local_dc + 0x24),(shared_ptr<LNode> *)(local_dc + 0x14)
             ,(shared_ptr<LNode> *)(local_dc + 4));
  std::make_shared<LNodeData<LNodeExpr>,LNodeType,LNodeExpr>((LNodeType *)&r,(LNodeExpr *)local_dc);
  LNodeExpr::~LNodeExpr(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_dc + 0xc));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_dc + 0x1c));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  _Var1 = r.super___shared_ptr<LNodeData<LNodeExpr>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  r.super___shared_ptr<LNodeData<LNodeExpr>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl =
       (LLexer *)r.super___shared_ptr<LNodeData<LNodeExpr>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  r.super___shared_ptr<LNodeData<LNodeExpr>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r.super___shared_ptr<LNodeData<LNodeExpr>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&expr0.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&op.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&atom.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_21() {
    // Expr0 : Atom BinOP0 Expr0
    auto atom = this->get_node(3);
    auto op = this->get_node(2);
    auto expr0 = this->get_node(1);
    auto r = std::make_shared<LNodeData<LNodeExpr>>(LNodeType::Expr, LNodeExpr(op, atom, expr0));
    return r;
}